

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

Vec_Int_t *
Saig_StrSimPerformMatching(Aig_Man_t *p0,Aig_Man_t *p1,int nDist,int fVerbose,Aig_Man_t **ppMiter)

{
  Aig_Obj_t *pAVar1;
  Aig_Man_t **ppAVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  abctime aVar6;
  abctime aVar7;
  Vec_Int_t *p;
  int *piVar8;
  Aig_Obj_t *pAVar9;
  Aig_Man_t *pAVar10;
  int iVar11;
  ulong uVar12;
  Vec_Ptr_t *p_00;
  ulong uVar13;
  int i;
  Aig_Man_t *pPart0;
  Aig_Man_t *pPart1;
  int local_44;
  Aig_Man_t **local_40;
  abctime local_38;
  
  local_44 = nDist;
  aVar6 = Abc_Clock();
  uVar12 = 1;
  Aig_ManRandom(1);
  if (p1 == (Aig_Man_t *)0x0) {
    if (fVerbose != 0) {
      Aig_ManPrintStats(p0);
    }
    iVar3 = Saig_ManDemiterSimpleDiff(p0,&pPart0,&pPart1);
    if (iVar3 == 0) {
      Abc_Print((int)p0,"Demitering has failed.\n");
      return (Vec_Int_t *)0x0;
    }
  }
  else {
    pPart0 = Aig_ManDupSimple(p0);
    pPart1 = Aig_ManDupSimple(p1);
  }
  local_40 = ppMiter;
  local_38 = aVar6;
  if (fVerbose == 0) {
    Saig_StrSimPrepareAig(pPart0);
    Saig_StrSimPrepareAig(pPart1);
    Saig_StrSimSetInitMatching(pPart0,pPart1);
  }
  else {
    Aig_ManPrintStats(pPart0);
    Aig_ManPrintStats(pPart1);
    Saig_StrSimPrepareAig(pPart0);
    Saig_StrSimPrepareAig(pPart1);
    pAVar10 = pPart0;
    Saig_StrSimSetInitMatching(pPart0,pPart1);
    iVar3 = (int)pAVar10;
    Abc_Print(iVar3,"Allocated %6.2f MB to simulate the first AIG.\n",
              (double)pPart0->vObjs->nSize * 16.0 * 4.0 * 9.5367431640625e-07);
    Abc_Print(iVar3,"Allocated %6.2f MB to simulate the second AIG.\n",
              (double)pPart1->vObjs->nSize * 16.0 * 4.0 * 9.5367431640625e-07);
  }
  uVar13 = 0;
  do {
    if ((int)uVar12 < 1) break;
    aVar6 = Abc_Clock();
    Saig_StrSimulateRound(pPart0,pPart1);
    uVar4 = Saig_StrSimDetectUnique(pPart0,pPart1);
    uVar12 = (ulong)uVar4;
    if (fVerbose != 0) {
      uVar4 = Saig_StrSimCountMatchedFlops(pPart0);
      pAVar10 = pPart0;
      uVar5 = Saig_StrSimCountMatchedNodes(pPart0);
      iVar3 = (int)pAVar10;
      Abc_Print(iVar3,"%3d : Match =%6d.  FF =%6d. (%6.2f %%)  Node =%6d. (%6.2f %%)  ",
                ((double)(int)uVar4 * 100.0) / (double)pPart0->nRegs,
                ((double)(int)uVar5 * 100.0) / (double)(pPart0->nObjs[6] + pPart0->nObjs[5]),uVar13,
                uVar12,(ulong)uVar4,(ulong)uVar5);
      Abc_Print(iVar3,"%s =","Time");
      aVar7 = Abc_Clock();
      Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar7 - aVar6) / 1000000.0);
    }
    uVar4 = (int)uVar13 + 1;
    uVar13 = (ulong)uVar4;
  } while (uVar4 != 0x15);
  Vec_PtrFree((Vec_Ptr_t *)pPart0->pData2);
  pPart0->pData2 = (void *)0x0;
  Vec_PtrFree((Vec_Ptr_t *)pPart1->pData2);
  pPart1->pData2 = (void *)0x0;
  Aig_ManFanoutStart(pPart0);
  Aig_ManFanoutStart(pPart1);
  if (local_44 != 0) {
    Ssw_StrSimMatchingExtend(pPart0,pPart1,local_44,fVerbose);
  }
  Saig_StrSimSetFinalMatching(pPart0,pPart1);
  pAVar10 = pPart0;
  p_00 = pPart0->vObjs;
  iVar3 = p_00->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar3 * 2 - 1U) {
    iVar11 = iVar3 * 2;
  }
  p->nSize = 0;
  p->nCap = iVar11;
  i = 0;
  if (iVar11 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar11 << 2);
  }
  p->pArray = piVar8;
  do {
    ppAVar2 = local_40;
    if (iVar3 <= i) {
      if (local_40 != (Aig_Man_t **)0x0) {
        pAVar10 = Saig_ManWindowExtractMiter(pAVar10,pPart1);
        *ppAVar2 = pAVar10;
        pAVar10 = pPart0;
      }
      Aig_ManFanoutStop(pAVar10);
      Aig_ManFanoutStop(pPart1);
      Aig_ManStop(pPart0);
      pAVar10 = pPart1;
      Aig_ManStop(pPart1);
      iVar3 = (int)pAVar10;
      Abc_Print(iVar3,"%s =","Total runtime");
      aVar6 = Abc_Clock();
      Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar6 - local_38) / 1000000.0);
      return p;
    }
    pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(p_00,i);
    if ((pAVar9 != (Aig_Obj_t *)0x0) && (pPart0->pReprs != (Aig_Obj_t **)0x0)) {
      pAVar1 = pPart0->pReprs[pAVar9->Id];
      if (pAVar1 != (Aig_Obj_t *)0x0) {
        if ((pPart1->pReprs == (Aig_Obj_t **)0x0) || (pAVar9 != pPart1->pReprs[pAVar1->Id])) {
          __assert_fail("pObj0 == Aig_ObjRepr(pPart1, pObj1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigStrSim.c"
                        ,0x3bb,
                        "Vec_Int_t *Saig_StrSimPerformMatching(Aig_Man_t *, Aig_Man_t *, int, int, Aig_Man_t **)"
                       );
        }
        Vec_IntPush(p,pAVar9->Id);
        Vec_IntPush(p,pAVar1->Id);
      }
    }
    i = i + 1;
    p_00 = pPart0->vObjs;
    iVar3 = p_00->nSize;
    pAVar10 = pPart0;
  } while( true );
}

Assistant:

Vec_Int_t * Saig_StrSimPerformMatching( Aig_Man_t * p0, Aig_Man_t * p1, int nDist, int fVerbose, Aig_Man_t ** ppMiter )
{
    extern Aig_Man_t * Saig_ManWindowExtractMiter( Aig_Man_t * p0, Aig_Man_t * p1 );

    Vec_Int_t * vPairs;
    Aig_Man_t * pPart0, * pPart1;
    Aig_Obj_t * pObj0, * pObj1;
    int i, nMatches;
    abctime clk, clkTotal = Abc_Clock();
    Aig_ManRandom( 1 );
    // consider the case when a miter is given
    if ( p1 == NULL )
    {
        if ( fVerbose )
        {
            Aig_ManPrintStats( p0 );
        }
        // demiter the miter
        if ( !Saig_ManDemiterSimpleDiff( p0, &pPart0, &pPart1 ) )
        {
            Abc_Print( 1, "Demitering has failed.\n" );
            return NULL;
        }
    }
    else
    {
        pPart0 = Aig_ManDupSimple( p0 );
        pPart1 = Aig_ManDupSimple( p1 );
    }
    if ( fVerbose )
    {
        Aig_ManPrintStats( pPart0 );
        Aig_ManPrintStats( pPart1 );
    }
    // start simulation 
    Saig_StrSimPrepareAig( pPart0 );
    Saig_StrSimPrepareAig( pPart1 );
    Saig_StrSimSetInitMatching( pPart0, pPart1 );
    if ( fVerbose )
    {
        Abc_Print( 1, "Allocated %6.2f MB to simulate the first AIG.\n",
            1.0 * Aig_ManObjNumMax(pPart0) * SAIG_WORDS * sizeof(unsigned) / (1<<20) );
        Abc_Print( 1, "Allocated %6.2f MB to simulate the second AIG.\n",
            1.0 * Aig_ManObjNumMax(pPart1) * SAIG_WORDS * sizeof(unsigned) / (1<<20) );
    }
    // iterate matching
    nMatches = 1;
    for ( i = 0; nMatches > 0; i++ )
    {
        clk = Abc_Clock();
        Saig_StrSimulateRound( pPart0, pPart1 );
        nMatches = Saig_StrSimDetectUnique( pPart0, pPart1 );
        if ( fVerbose )
        {
            int nFlops = Saig_StrSimCountMatchedFlops(pPart0);
            int nNodes = Saig_StrSimCountMatchedNodes(pPart0);
            Abc_Print( 1, "%3d : Match =%6d.  FF =%6d. (%6.2f %%)  Node =%6d. (%6.2f %%)  ",
                i, nMatches,
                nFlops, 100.0*nFlops/Aig_ManRegNum(pPart0),
                nNodes, 100.0*nNodes/Aig_ManNodeNum(pPart0) );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( i == 20 )
            break;
    }
    // cleanup
    Vec_PtrFree( (Vec_Ptr_t *)pPart0->pData2 ); pPart0->pData2 = NULL;
    Vec_PtrFree( (Vec_Ptr_t *)pPart1->pData2 ); pPart1->pData2 = NULL;
    // extend the islands
    Aig_ManFanoutStart( pPart0 );
    Aig_ManFanoutStart( pPart1 );
    if ( nDist )
        Ssw_StrSimMatchingExtend( pPart0, pPart1, nDist, fVerbose );
    Saig_StrSimSetFinalMatching( pPart0, pPart1 );
//    Saig_StrSimSetContiguousMatching( pPart0, pPart1 );
    // copy the results into array
    vPairs = Vec_IntAlloc( 2*Aig_ManObjNumMax(pPart0) );
    Aig_ManForEachObj( pPart0, pObj0, i )
    {
        pObj1 = Aig_ObjRepr(pPart0, pObj0);
        if ( pObj1 == NULL )
            continue;
        assert( pObj0 == Aig_ObjRepr(pPart1, pObj1) );
        Vec_IntPush( vPairs, pObj0->Id );
        Vec_IntPush( vPairs, pObj1->Id );
    }
    // this procedure adds matching of PO and LI
    if ( ppMiter )
        *ppMiter = Saig_ManWindowExtractMiter( pPart0, pPart1 );
    Aig_ManFanoutStop( pPart0 );
    Aig_ManFanoutStop( pPart1 );
    Aig_ManStop( pPart0 );
    Aig_ManStop( pPart1 );
    ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
    return vPairs;
}